

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::AJoint::Solve(AJoint *this,btScalar dt,btScalar sor)

{
  btMatrix3x3 *m;
  Body *this_00;
  long in_RDI;
  btScalar bVar1;
  Impulse impulse;
  btVector3 vc;
  btScalar sp;
  btVector3 vr;
  btVector3 vb;
  btVector3 va;
  Impulse *in_stack_fffffffffffffed8;
  btVector3 *in_stack_fffffffffffffee8;
  btVector3 *v2;
  Impulse *in_stack_fffffffffffffef0;
  Impulse *in_stack_ffffffffffffff10;
  btVector3 local_40;
  btScalar local_30 [4];
  btScalar local_20 [4];
  
  local_20 = (btScalar  [4])Body::angularVelocity((Body *)in_stack_fffffffffffffef0);
  local_30 = (btScalar  [4])Body::angularVelocity((Body *)in_stack_fffffffffffffef0);
  local_40 = operator-(&in_stack_fffffffffffffef0->m_velocity,in_stack_fffffffffffffee8);
  this_00 = (Body *)(in_RDI + 0xb8);
  v2 = &local_40;
  bVar1 = btDot((btVector3 *)this_00,&in_stack_fffffffffffffed8->m_velocity);
  (**(code **)(**(long **)(in_RDI + 0xd8) + 0x18))(bVar1);
  ::operator*(&in_stack_fffffffffffffef0->m_velocity,v2->m_floats);
  operator-(&in_stack_fffffffffffffef0->m_velocity,v2);
  Impulse::Impulse(in_stack_fffffffffffffef0);
  m = (btMatrix3x3 *)(in_RDI + 100);
  ::operator*((btVector3 *)m,v2->m_floats);
  operator+(m->m_el,v2);
  ::operator*(m,v2);
  ::operator*(m->m_el,v2->m_floats);
  Impulse::operator-(in_stack_ffffffffffffff10);
  Body::applyAImpulse(this_00,in_stack_fffffffffffffed8);
  Body::applyAImpulse(this_00,in_stack_fffffffffffffed8);
  return;
}

Assistant:

void				btSoftBody::AJoint::Solve(btScalar dt,btScalar sor)
{
	const btVector3		va=m_bodies[0].angularVelocity();
	const btVector3		vb=m_bodies[1].angularVelocity();
	const btVector3		vr=va-vb;
	const btScalar		sp=btDot(vr,m_axis[0]);
	const btVector3		vc=vr-m_axis[0]*m_icontrol->Speed(this,sp);
	btSoftBody::Impulse	impulse;
	impulse.m_asVelocity	=	1;
	impulse.m_velocity		=	m_massmatrix*(m_drift+vc*m_cfm)*sor;
	m_bodies[0].applyAImpulse(-impulse);
	m_bodies[1].applyAImpulse( impulse);
}